

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_KDF_SCHEME_Unmarshal(TPMU_KDF_SCHEME *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_KDF_SCHEME *target_local;
  
  switch(selector) {
  case 7:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)target,buffer,size,0);
    break;
  default:
    target_local._4_4_ = 0x98;
    break;
  case 0x10:
    target_local._4_4_ = 0;
    break;
  case 0x20:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)target,buffer,size,0);
    break;
  case 0x22:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)target,buffer,size,0);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_KDF_SCHEME_Unmarshal(TPMU_KDF_SCHEME *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_MGF1
        case TPM_ALG_MGF1:
            return TPMS_SCHEME_MGF1_Unmarshal((TPMS_SCHEME_MGF1 *)&(target->mgf1), buffer, size);
#endif // ALG_MGF1
#if         ALG_KDF1_SP800_56A
        case TPM_ALG_KDF1_SP800_56A:
            return TPMS_SCHEME_KDF1_SP800_56A_Unmarshal((TPMS_SCHEME_KDF1_SP800_56A *)&(target->kdf1_sp800_56a), buffer, size);
#endif // ALG_KDF1_SP800_56A
#if         ALG_KDF2
        case TPM_ALG_KDF2:
            return TPMS_SCHEME_KDF2_Unmarshal((TPMS_SCHEME_KDF2 *)&(target->kdf2), buffer, size);
#endif // ALG_KDF2
#if         ALG_KDF1_SP800_108
        case TPM_ALG_KDF1_SP800_108:
            return TPMS_SCHEME_KDF1_SP800_108_Unmarshal((TPMS_SCHEME_KDF1_SP800_108 *)&(target->kdf1_sp800_108), buffer, size);
#endif // ALG_KDF1_SP800_108
        case TPM_ALG_NULL:
            return TPM_RC_SUCCESS;
    }
    return TPM_RC_SELECTOR;
}